

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O3

int ini_find_section(ini_t *ini,char *name,int name_length)

{
  int iVar1;
  int iVar2;
  ini_internal_section_t *piVar3;
  ini_internal_section_t *__s2;
  long lVar4;
  
  if (name != (char *)0x0 && ini != (ini_t *)0x0) {
    if (name_length < 1) {
      name_length = sx_strlen(name);
    }
    iVar1 = ini->section_count;
    if (0 < (long)iVar1) {
      piVar3 = ini->sections;
      lVar4 = 0;
      do {
        __s2 = (ini_internal_section_t *)piVar3->name_large;
        if ((ini_internal_section_t *)piVar3->name_large == (ini_internal_section_t *)0x0) {
          __s2 = piVar3;
        }
        iVar2 = strncasecmp(name,__s2->name,(long)name_length);
        if (iVar2 == 0) {
          return (int)lVar4;
        }
        lVar4 = lVar4 + 1;
        piVar3 = piVar3 + 1;
      } while (iVar1 != lVar4);
    }
  }
  return -1;
}

Assistant:

int ini_find_section( ini_t const* ini, char const* name, int name_length )
    {
    int i;

    if( ini && name )
        {
        if( name_length <= 0 ) name_length = (int) INI_STRLEN( name );
        for( i = 0; i < ini->section_count; ++i )
            {
            char const* const other = 
                ini->sections[ i ].name_large ? ini->sections[ i ].name_large : ini->sections[ i ].name;
            if( INI_STRNICMP( name, other, name_length ) == 0 )
                return i;
            }
        }

    return INI_NOT_FOUND;
    }